

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessCompactBlockTxns
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,BlockTransactions *block_transactions)

{
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  __first;
  optional<long> from_peer;
  optional<long> from_peer_00;
  optional<long> from_peer_01;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ReadStatus RVar4;
  uint32_t uVar5;
  difference_type dVar6;
  pointer ppVar7;
  NodeId NVar8;
  type_conflict5 *ptVar9;
  char *pcVar10;
  ConstevalFormatString<1U> fmt;
  long *args;
  _Storage<long,_true> in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar11;
  pair<long,_bool> pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_bool> pVar13;
  ReadStatus status;
  PartiallyDownloadedBlock *partialBlock;
  type *block_it;
  type_conflict5 *node_id;
  bool first_in_flight;
  bool requested_block_from_this_peer;
  size_t already_in_flight;
  bool fBlockRead;
  vector<CInv,_std::allocator<CInv>_> invs;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  range_flight;
  shared_ptr<CBlock> pblock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  Peer *in_stack_fffffffffffffce0;
  PeerManagerImpl *in_stack_fffffffffffffce8;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  char *in_stack_fffffffffffffd00;
  vector<CInv,_std::allocator<CInv>_> *in_stack_fffffffffffffd08;
  undefined2 uVar14;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_> in_stack_fffffffffffffd18;
  PeerManagerImpl *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  Peer *in_stack_fffffffffffffd38;
  PeerManagerImpl *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  _Storage<long,_true> in_stack_fffffffffffffd80;
  ConstevalFormatString<1U> in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar15;
  char *in_stack_fffffffffffffd98;
  long in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 uVar16;
  bool bVar17;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  type block;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  int iVar18;
  undefined1 local_1a8 [16];
  long local_198;
  undefined1 local_190;
  undefined1 local_181;
  Level level;
  undefined8 in_stack_fffffffffffffe80;
  long *in_stack_fffffffffffffe90;
  allocator<char> local_13d;
  uint local_13c;
  allocator<char> local_119;
  NodeId local_118;
  NodeId local_110;
  long local_e8;
  _List_node_base *local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  long local_98;
  undefined1 local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_shared<CBlock>();
  bVar1 = false;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18._M_node,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
             SUB41((uint)in_stack_fffffffffffffcf8 >> 0x18,0));
  pVar11 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                          *)in_stack_fffffffffffffce8,(key_type *)in_stack_fffffffffffffce0);
  local_d8 = (_Base_ptr)pVar11.second._M_node;
  local_d0 = (_Base_ptr)pVar11.first._M_node;
  __first._M_node._4_4_ = in_stack_fffffffffffffcfc;
  __first._M_node._0_4_ = in_stack_fffffffffffffcf8;
  local_c8 = local_d0;
  local_c0 = local_d8;
  dVar6 = std::
          distance<std::_Rb_tree_iterator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                    (__first,in_stack_fffffffffffffcf0);
  bVar3 = false;
  uVar16 = true;
  bVar17 = (bool)uVar16;
  if (dVar6 != 0) {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    in_stack_fffffffffffffda0 = (ppVar7->second).first;
    NVar8 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    uVar16 = in_stack_fffffffffffffda0 == NVar8;
    bVar17 = (bool)uVar16;
  }
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffce8,(_Self *)in_stack_fffffffffffffce0);
    level = (Level)in_stack_fffffffffffffe80;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_e8 = (ppVar7->second).first;
    local_e0 = (ppVar7->second).second._M_node;
    ptVar9 = std::get<0ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                       ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::get<1ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
              ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    in_stack_fffffffffffffd98 = (char *)*ptVar9;
    pcVar10 = (char *)CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,
                                                     in_stack_fffffffffffffcd8));
    if (in_stack_fffffffffffffd98 == pcVar10) {
      std::_List_iterator<(anonymous_namespace)::QueuedBlock>::operator->
                ((_List_iterator<(anonymous_namespace)::QueuedBlock> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
                          *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      level = (Level)in_stack_fffffffffffffe80;
      if (bVar2) {
        bVar3 = true;
        break;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                  *)in_stack_fffffffffffffcf0._M_node,
                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  }
  if (bVar3) {
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::_List_iterator<(anonymous_namespace)::QueuedBlock>::operator->
              ((_List_iterator<(anonymous_namespace)::QueuedBlock> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    fmt.fmt = (char *)std::
                      unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
                      ::operator*((unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
                                   *)in_stack_fffffffffffffce8);
    block = (type)fmt.fmt;
    std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffce8);
    RVar4 = PartiallyDownloadedBlock::FillBlock
                      ((PartiallyDownloadedBlock *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),(CBlock *)block
                       ,(vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (RVar4 == READ_STATUS_INVALID) {
      local_118 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8
                                                ));
      std::optional<long>::optional<long,_true>
                ((optional<long> *)in_stack_fffffffffffffce8,&in_stack_fffffffffffffce0->m_id);
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._8_8_ = fmt.fmt;
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._M_payload._M_value = in_RCX._M_value;
      RemoveBlockRequest((PeerManagerImpl *)in_stack_fffffffffffffd18._M_node,
                         (uint256 *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         from_peer);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                 (allocator<char> *)in_stack_fffffffffffffd18._M_node);
      Misbehaving(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                  (string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::allocator<char>::~allocator(&local_119);
      iVar18 = 1;
    }
    else {
      if (RVar4 == READ_STATUS_FAILED) {
        if (bVar17 == false) {
          CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          std::optional<long>::optional<long,_true>
                    ((optional<long> *)in_stack_fffffffffffffce8,&in_stack_fffffffffffffce0->m_id);
          from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = fmt.fmt;
          from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               in_stack_fffffffffffffd80._M_value;
          RemoveBlockRequest((PeerManagerImpl *)in_stack_fffffffffffffd18._M_node,
                             (uint256 *)
                             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                             from_peer_00);
          bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                                      Trace);
          iVar18 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd4c);
          if (bVar3) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       (char *)in_stack_fffffffffffffcf0._M_node);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       (char *)in_stack_fffffffffffffcf0._M_node);
            args = (long *)CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,
                                                          in_stack_fffffffffffffcd8));
            in_stack_fffffffffffffcd8 = 1;
            logging_function_00._M_str._0_7_ = in_stack_fffffffffffffda8;
            logging_function_00._M_len = in_stack_fffffffffffffda0;
            logging_function_00._M_str._7_1_ = uVar16;
            source_file_00._M_len._4_4_ = in_stack_fffffffffffffd94;
            source_file_00._M_len._0_4_ = RVar4;
            source_file_00._M_str = in_stack_fffffffffffffd98;
            LogPrintFormatInternal<long>
                      (logging_function_00,source_file_00,iVar18,(LogFlags)in_stack_fffffffffffffd40
                       ,level,fmt,args);
          }
          iVar18 = 1;
          goto LAB_002ca613;
        }
        std::vector<CInv,_std::allocator<CInv>_>::vector
                  ((vector<CInv,_std::allocator<CInv>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        uVar5 = GetFetchFlags(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_13c = uVar5 | 2;
        std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256_const&>
                  ((vector<CInv,_std::allocator<CInv>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                   &(in_stack_fffffffffffffcf0._M_node)->_M_color,
                   (uint256 *)in_stack_fffffffffffffce8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                   (allocator<char> *)in_stack_fffffffffffffd18._M_node);
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                  (in_stack_fffffffffffffd20,(CNode *)in_stack_fffffffffffffd18._M_node,
                   (string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        std::allocator<char>::~allocator(&local_13d);
        std::vector<CInv,_std::allocator<CInv>_>::~vector
                  ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffce8);
      }
      else {
        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        std::optional<long>::optional<long,_true>
                  ((optional<long> *)in_stack_fffffffffffffce8,&in_stack_fffffffffffffce0->m_id);
        from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ = fmt.fmt;
        from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = in_stack_fffffffffffffd80._M_value;
        RemoveBlockRequest((PeerManagerImpl *)in_stack_fffffffffffffd18._M_node,
                           (uint256 *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                           from_peer_01);
        bVar1 = true;
        in_stack_fffffffffffffd20 = (PeerManagerImpl *)(in_RDI + 0x2d0);
        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_181 = 0;
        pVar12 = std::make_pair<long,bool>
                           ((long *)in_stack_fffffffffffffce8,(bool *)in_stack_fffffffffffffce0);
        local_198 = pVar12.first;
        local_190 = pVar12.second;
        local_98 = local_198;
        local_90 = local_190;
        pVar13 = std::
                 map<uint256,std::pair<long,bool>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                 ::emplace<uint256_const&,std::pair<long,bool>>
                           ((map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                            (uint256 *)in_stack_fffffffffffffcf0._M_node,
                            (pair<long,_bool> *)in_stack_fffffffffffffce8);
        in_stack_fffffffffffffd18 = pVar13.first._M_node;
        in_stack_fffffffffffffd17 = pVar13.second;
        local_a8 = in_stack_fffffffffffffd18._M_node;
        local_a0 = in_stack_fffffffffffffd17;
      }
      iVar18 = 0;
    }
  }
  else {
    bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),Trace)
    ;
    uVar15 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd94);
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (char *)in_stack_fffffffffffffcf0._M_node);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (char *)in_stack_fffffffffffffcf0._M_node);
      local_110 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8
                                                ));
      in_stack_fffffffffffffcd8 = 1;
      logging_function._M_str._0_7_ = in_stack_fffffffffffffda8;
      logging_function._M_len = in_stack_fffffffffffffda0;
      logging_function._M_str._7_1_ = uVar16;
      source_file._M_len._4_4_ = uVar15;
      source_file._M_len._0_4_ = in_stack_fffffffffffffd90;
      source_file._M_str = in_stack_fffffffffffffd98;
      LogPrintFormatInternal<long>
                (logging_function,source_file,in_stack_fffffffffffffd4c,
                 (LogFlags)in_stack_fffffffffffffd40,level,in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffe90);
    }
    iVar18 = 1;
  }
LAB_002ca613:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if ((iVar18 == 0) && (bVar1)) {
    uVar14 = (undefined2)((ulong)local_1a8 >> 0x30);
    std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (shared_ptr<CBlock> *)0x2ca666);
    ProcessBlock(in_stack_fffffffffffffd20,(CNode *)in_stack_fffffffffffffd18._M_node,
                 (shared_ptr<const_CBlock> *)
                 CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 SUB21((ushort)uVar14 >> 8,0),SUB21(uVar14,0));
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  }
  std::shared_ptr<CBlock>::~shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessCompactBlockTxns(CNode& pfrom, Peer& peer, const BlockTransactions& block_transactions)
{
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    bool fBlockRead{false};
    {
        LOCK(cs_main);

        auto range_flight = mapBlocksInFlight.equal_range(block_transactions.blockhash);
        size_t already_in_flight = std::distance(range_flight.first, range_flight.second);
        bool requested_block_from_this_peer{false};

        // Multimap ensures ordering of outstanding requests. It's either empty or first in line.
        bool first_in_flight = already_in_flight == 0 || (range_flight.first->second.first == pfrom.GetId());

        while (range_flight.first != range_flight.second) {
            auto [node_id, block_it] = range_flight.first->second;
            if (node_id == pfrom.GetId() && block_it->partialBlock) {
                requested_block_from_this_peer = true;
                break;
            }
            range_flight.first++;
        }

        if (!requested_block_from_this_peer) {
            LogDebug(BCLog::NET, "Peer %d sent us block transactions for block we weren't expecting\n", pfrom.GetId());
            return;
        }

        PartiallyDownloadedBlock& partialBlock = *range_flight.first->second.second->partialBlock;
        ReadStatus status = partialBlock.FillBlock(*pblock, block_transactions.txn);
        if (status == READ_STATUS_INVALID) {
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // Reset in-flight state in case Misbehaving does not result in a disconnect
            Misbehaving(peer, "invalid compact block/non-matching block transactions");
            return;
        } else if (status == READ_STATUS_FAILED) {
            if (first_in_flight) {
                // Might have collided, fall back to getdata now :(
                std::vector<CInv> invs;
                invs.emplace_back(MSG_BLOCK | GetFetchFlags(peer), block_transactions.blockhash);
                MakeAndPushMessage(pfrom, NetMsgType::GETDATA, invs);
            } else {
                RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId());
                LogDebug(BCLog::NET, "Peer %d sent us a compact block but it failed to reconstruct, waiting on first download to complete\n", pfrom.GetId());
                return;
            }
        } else {
            // Block is either okay, or possibly we received
            // READ_STATUS_CHECKBLOCK_FAILED.
            // Note that CheckBlock can only fail for one of a few reasons:
            // 1. bad-proof-of-work (impossible here, because we've already
            //    accepted the header)
            // 2. merkleroot doesn't match the transactions given (already
            //    caught in FillBlock with READ_STATUS_FAILED, so
            //    impossible here)
            // 3. the block is otherwise invalid (eg invalid coinbase,
            //    block is too big, too many legacy sigops, etc).
            // So if CheckBlock failed, #3 is the only possibility.
            // Under BIP 152, we don't discourage the peer unless proof of work is
            // invalid (we don't require all the stateless checks to have
            // been run).  This is handled below, so just treat this as
            // though the block was successfully read, and rely on the
            // handling in ProcessNewBlock to ensure the block index is
            // updated, etc.
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // it is now an empty pointer
            fBlockRead = true;
            // mapBlockSource is used for potentially punishing peers and
            // updating which peers send us compact blocks, so the race
            // between here and cs_main in ProcessNewBlock is fine.
            // BIP 152 permits peers to relay compact blocks after validating
            // the header only; we should not punish peers if the block turns
            // out to be invalid.
            mapBlockSource.emplace(block_transactions.blockhash, std::make_pair(pfrom.GetId(), false));
        }
    } // Don't hold cs_main when we call into ProcessNewBlock
    if (fBlockRead) {
        // Since we requested this block (it was in mapBlocksInFlight), force it to be processed,
        // even if it would not be a candidate for new tip (missing previous block, chain not long enough, etc)
        // This bypasses some anti-DoS logic in AcceptBlock (eg to prevent
        // disk-space attacks), but this should be safe due to the
        // protections in the compact block handler -- see related comment
        // in compact block optimistic reconstruction handling.
        ProcessBlock(pfrom, pblock, /*force_processing=*/true, /*min_pow_checked=*/true);
    }
    return;
}